

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_char_iterator_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::StringCharIteratorTest_test_next1_Test::
~StringCharIteratorTest_test_next1_Test(StringCharIteratorTest_test_next1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StringCharIteratorTest, test_next1)
{
    StringCharIterator tok = StringCharIterator("bid=22,ask=23,size=99", ',');
    ASSERT_STREQ("bid", tok.Next('=').c_str());
    ASSERT_STREQ("22", tok.Next(',').c_str());
    ASSERT_STREQ("ask", tok.Next('=').c_str());
    ASSERT_STREQ("23", tok.Next(',').c_str());
    ASSERT_STREQ("size", tok.Next('=').c_str());
    ASSERT_STREQ("99", tok.Next(',').c_str());
    ASSERT_FALSE(tok.HasNext());
}